

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O0

bool __thiscall Clasp::ClaspFacade::SolveStrategy::setModel(SolveStrategy *this,Solver *s,Model *m)

{
  long *plVar1;
  byte bVar2;
  bool bVar3;
  uint uVar4;
  __sighandler_t p_Var5;
  undefined8 in_RDX;
  __sighandler_t extraout_RDX;
  __sighandler_t extraout_RDX_00;
  int __sig;
  Solver *in_RSI;
  Solver *in_RDI;
  bool ok;
  undefined6 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd6;
  undefined1 in_stack_ffffffffffffffd7;
  undefined6 in_stack_ffffffffffffffe0;
  byte bVar6;
  
  *(byte *)((long)&(in_RDI->stats).super_CoreStats.lastRestart + 4) =
       *(byte *)((long)&(in_RDI->stats).super_CoreStats.lastRestart + 4) | 1;
  bVar6 = 1;
  if ((in_RDI->stats).super_CoreStats.analyzed != 0) {
    plVar1 = (long *)(in_RDI->stats).super_CoreStats.analyzed;
    bVar6 = (**(code **)(*plVar1 + 0x10))(plVar1,in_RSI,in_RDX);
  }
  bVar2 = bVar6 & 1;
  Solver::sharedContext(in_RSI);
  __sig = (int)in_RSI;
  bVar3 = SharedContext::report
                    ((SharedContext *)CONCAT17(bVar2,CONCAT16(bVar6,in_stack_ffffffffffffffe0)),
                     in_RDI,(Model *)CONCAT17(in_stack_ffffffffffffffd7,
                                              CONCAT16(in_stack_ffffffffffffffd6,
                                                       in_stack_ffffffffffffffd0)));
  if (!bVar3) {
    bVar2 = 0;
  }
  bVar2 = bVar2 & 1;
  uVar4 = SolveMode_t::operator_cast_to_unsigned_int
                    ((SolveMode_t *)&(in_RDI->stats).super_CoreStats.blRestarts);
  p_Var5 = extraout_RDX;
  if ((uVar4 & 2) != 0) {
    __sig = 1;
    (**(code **)(*(long *)in_RDI + 0x20))();
    p_Var5 = extraout_RDX_00;
  }
  bVar6 = 0;
  if ((bVar2 & 1) != 0) {
    p_Var5 = signal((SolveStrategy *)in_RDI,__sig,p_Var5);
    bVar6 = (int)p_Var5 != 0 ^ 0xff;
  }
  return (bool)(bVar6 & 1);
}

Assistant:

bool setModel(const Solver& s, const Model& m) {
		result_.flags |= SolveResult::SAT;
		bool ok = !handler_ || handler_->onModel(s, m);
		ok      = s.sharedContext()->report(s, m) && ok;
		if ((mode_ & SolveMode_t::Yield) != 0) { doNotify(event_model); }
		return ok && !signal();
	}